

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

TypeReferenceSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::TypeReferenceSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,ExpressionSyntax *args_2,Token *args_3)

{
  Token closeParen;
  TypeReferenceSyntax *this_00;
  Token *in_RDX;
  long in_RSI;
  Token *in_R8;
  ExpressionSyntax *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  BumpAllocator *in_stack_ffffffffffffffa8;
  
  this_00 = (TypeReferenceSyntax *)
            allocate(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                     (size_t)in_stack_ffffffffffffff98);
  closeParen.info = (Info *)in_R8;
  closeParen._0_8_ = *(undefined8 *)(in_RSI + 8);
  slang::syntax::TypeReferenceSyntax::TypeReferenceSyntax
            (this_00,*in_RDX,*in_R8,in_stack_ffffffffffffff98,closeParen);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }